

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerFrameDisplayCheck(Lowerer *this,Instr *instr)

{
  uint uVar1;
  Instr *insertBeforeInstr;
  Instr *pIVar2;
  long *plVar3;
  SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  code *pcVar5;
  LabelInstr *instr_00;
  bool bVar6;
  Opnd *this_00;
  AddrOpnd *pAVar7;
  RegOpnd *baseOpnd;
  undefined4 *puVar8;
  Type *pTVar9;
  LabelInstr *target;
  IndirOpnd *pIVar10;
  RegOpnd *baseOpnd_00;
  IntConstOpnd *pIVar11;
  Instr *instr_01;
  ulong uVar12;
  Lowerer *pLVar13;
  long lVar14;
  Iterator local_48;
  LabelInstr *local_38;
  
  insertBeforeInstr = instr->m_next;
  pIVar2 = instr->m_prev;
  this_00 = IR::Instr::UnlinkSrc2(instr);
  pAVar7 = IR::Opnd::AsAddrOpnd(this_00);
  plVar3 = (long *)pAVar7->m_address;
  baseOpnd = IR::Opnd::AsRegOpnd(instr->m_dst);
  if ((int)plVar3[1] + 1U < 3) {
    local_38 = (LabelInstr *)0x0;
    target = (LabelInstr *)0x0;
  }
  else {
    target = IR::LabelInstr::New(Label,this->m_func,true);
    local_38 = IR::LabelInstr::New(Label,this->m_func,false);
    pIVar10 = IR::IndirOpnd::New(baseOpnd,2,TyUint16,this->m_func,true);
    pLVar13 = (Lowerer *)(ulong)((int)plVar3[1] - 1);
    pIVar11 = IR::IntConstOpnd::New((IntConstType)pLVar13,TyUint16,this->m_func,false);
    InsertCompareBranch(pLVar13,&pIVar10->super_Opnd,&pIVar11->super_Opnd,BrLe_A,true,target,
                        insertBeforeInstr,false);
  }
  lVar14 = *plVar3;
  if (lVar14 != 0) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar12 = 0; uVar12 < *(uint *)(lVar14 + 8); uVar12 = uVar12 + 1) {
      local_48.list =
           (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)
           (uVar12 * 0x10 + *(long *)(lVar14 + 0x10));
      local_48.current = (NodeBase *)local_48.list;
      while( true ) {
        if ((SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)local_48.current
            == (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar8 = 0;
        }
        pSVar4 = (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)
                 ((SListNodeBase<Memory::ArenaAllocator> *)&(local_48.current)->next)->next;
        if (pSVar4 == local_48.list) break;
        local_48.current = (NodeBase *)pSVar4;
        pTVar9 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           (&local_48);
        uVar1 = pTVar9->element;
        if (uVar1 - 3 < 0xfffffffc) {
          if (target == (LabelInstr *)0x0) {
            target = IR::LabelInstr::New(Label,this->m_func,true);
            local_38 = IR::LabelInstr::New(Label,this->m_func,false);
          }
          pIVar10 = IR::IndirOpnd::New(baseOpnd,pTVar9->value << 3,TyVar,this->m_func,true);
          baseOpnd_00 = IR::RegOpnd::New(TyVar,this->m_func);
          InsertMove(&baseOpnd_00->super_Opnd,&pIVar10->super_Opnd,insertBeforeInstr,true);
          pIVar10 = IR::IndirOpnd::New(baseOpnd_00,0,TyVar,this->m_func,true);
          pLVar13 = (Lowerer *)(ulong)(uVar1 - 2);
          pIVar11 = IR::IntConstOpnd::New((IntConstType)pLVar13,TyUint32,this->m_func,false);
          InsertCompareBranch(pLVar13,&pIVar10->super_Opnd,&pIVar11->super_Opnd,BrLe_A,true,target,
                              insertBeforeInstr,false);
        }
      }
      lVar14 = *plVar3;
    }
  }
  instr_00 = local_38;
  if (target != (LabelInstr *)0x0) {
    InsertBranch(Br,local_38,insertBeforeInstr);
    IR::Instr::InsertBefore(insertBeforeInstr,&target->super_Instr);
    instr_01 = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstr,instr_01);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_01,HelperOp_FatalInternalError,(LabelInstr *)0x0,(Opnd *)0x0
               ,(PropertySymOpnd *)0x0,false);
    IR::Instr::InsertBefore(insertBeforeInstr,&instr_00->super_Instr);
  }
  LowererMD::ChangeToAssign(instr);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerFrameDisplayCheck(IR::Instr * instr)
{
    IR::Instr *instrPrev = instr->m_prev;
    IR::Instr *insertInstr = instr->m_next;
    IR::AddrOpnd *addrOpnd = instr->UnlinkSrc2()->AsAddrOpnd();
    FrameDisplayCheckRecord *record = (FrameDisplayCheckRecord*)addrOpnd->m_address;

    IR::LabelInstr *errorLabel = nullptr;
    IR::LabelInstr *continueLabel = nullptr;
    IR::RegOpnd *envOpnd = instr->GetDst()->AsRegOpnd();
    uint32 frameDisplayOffset = Js::FrameDisplay::GetOffsetOfScopes()/sizeof(Js::Var);

    if (record->slotId != (uint32)-1 && record->slotId > frameDisplayOffset)
    {
        // Check that the frame display has enough scopes in it to satisfy the code.
        errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(envOpnd,
                                                       Js::FrameDisplay::GetOffsetOfLength(),
                                                       TyUint16, m_func, true);

        IR::IntConstOpnd *slotIdOpnd = IR::IntConstOpnd::New(record->slotId - frameDisplayOffset, TyUint16, m_func);
        InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrLe_A, true, errorLabel, insertInstr);
    }

    if (record->table)
    {
        // Check the size of each of the slot arrays in the scope chain.
        FOREACH_HASHTABLE_ENTRY(uint32, bucket, record->table)
        {
            uint32 slotId = bucket.element;
            if (slotId != (uint32)-1 && slotId > Js::ScopeSlots::FirstSlotIndex)
            {
                if (errorLabel == nullptr)
                {
                    errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
                    continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
                }

                IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(envOpnd,
                                                               bucket.value * sizeof(Js::Var),
                                                               TyVar, m_func, true);
                IR::RegOpnd * slotArrayOpnd = IR::RegOpnd::New(TyVar, m_func);
                InsertMove(slotArrayOpnd, indirOpnd, insertInstr);

                indirOpnd = IR::IndirOpnd::New(slotArrayOpnd,
                                               Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
                                               TyVar, m_func, true);

                IR::IntConstOpnd * slotIdOpnd = IR::IntConstOpnd::New(slotId - Js::ScopeSlots::FirstSlotIndex,
                                                                      TyUint32, m_func);
                InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrLe_A, true, errorLabel, insertInstr);
            }
        }
        NEXT_HASHTABLE_ENTRY;
    }

    if (errorLabel)
    {
        InsertBranch(Js::OpCode::Br, continueLabel, insertInstr);

        insertInstr->InsertBefore(errorLabel);
        IR::Instr * instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
        insertInstr->InsertBefore(instrHelper);
        m_lowererMD.ChangeToHelperCall(instrHelper, IR::HelperOp_FatalInternalError);
        insertInstr->InsertBefore(continueLabel);
    }

    m_lowererMD.ChangeToAssign(instr);

    return instrPrev;
}